

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_relocate(_glist *x,t_symbol *canvasgeom,t_symbol *topgeom)

{
  int iVar1;
  int typix;
  int txpix;
  int ch;
  int cw;
  int th;
  int tw;
  int cypix;
  int cxpix;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  undefined1 local_18 [4];
  undefined1 local_14 [4];
  
  iVar1 = __isoc99_sscanf(canvasgeom->s_name,"%dx%d+%d+%d",&local_24,&local_28,local_14,local_18);
  if (3 < iVar1) {
    iVar1 = __isoc99_sscanf(topgeom->s_name,"%dx%d+%d+%d",local_1c,local_20,&local_2c,&local_30);
    if (3 < iVar1) goto LAB_0013a97d;
  }
  bug("canvas_relocate");
LAB_0013a97d:
  if (5 < local_28 && 5 < local_24) {
    canvas_dosetbounds(x,local_2c,local_30,local_24 + local_2c,local_28 + local_30);
  }
  return;
}

Assistant:

static void canvas_relocate(t_canvas *x, t_symbol *canvasgeom,
    t_symbol *topgeom)
{
    int cxpix, cypix, cw, ch, txpix, typix, tw, th;
    if (sscanf(canvasgeom->s_name, "%dx%d+%d+%d", &cw, &ch, &cxpix, &cypix)
        < 4 ||
        sscanf(topgeom->s_name, "%dx%d+%d+%d", &tw, &th, &txpix, &typix) < 4)
        bug("canvas_relocate");
            /* for some reason this is initially called with cw=ch=1 so
            we just suppress that here. */
    if (cw > 5 && ch > 5)
        canvas_dosetbounds(x, txpix, typix,
            txpix + cw, typix + ch);
}